

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udf_scalar_functions.hpp
# Opt level: O0

void sum_cols_int_check_nulls(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  StringRef capturedExpression;
  int iVar1;
  long in_RDX;
  int in_ESI;
  undefined8 in_RDI;
  int type;
  int i;
  int res_type;
  int sum;
  AssertionHandler catchAssertionHandler;
  undefined4 in_stack_fffffffffffffef8;
  Flags in_stack_fffffffffffffefc;
  char *in_stack_ffffffffffffff00;
  AssertionHandler *this;
  StringRef *in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  int iVar2;
  undefined4 in_stack_ffffffffffffff18;
  int iVar3;
  undefined4 in_stack_ffffffffffffff1c;
  int iVar4;
  undefined4 in_stack_ffffffffffffff20;
  uint in_stack_ffffffffffffff24;
  ExprLhs<const_int_&> *in_stack_ffffffffffffff28;
  AssertionHandler local_80;
  long local_18;
  int local_c;
  undefined8 local_8;
  
  local_18 = in_RDX;
  local_c = in_ESI;
  local_8 = in_RDI;
  local_80.m_assertionInfo.lineInfo =
       (SourceLineInfo)
       operator____catch_sr
                 (in_stack_ffffffffffffff00,
                  CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
  this = &local_80;
  Catch::SourceLineInfo::SourceLineInfo
            ((SourceLineInfo *)this,
             "/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/tools/sqlite3_api_wrapper/test/include/udf_scalar_functions.hpp"
             ,0x18);
  Catch::StringRef::StringRef
            ((StringRef *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
             (char *)in_stack_ffffffffffffff08);
  capturedExpression.m_start._4_4_ = in_stack_ffffffffffffff1c;
  capturedExpression.m_start._0_4_ = in_stack_ffffffffffffff18;
  capturedExpression.m_size._0_4_ = in_stack_ffffffffffffff20;
  capturedExpression.m_size._4_4_ = in_stack_ffffffffffffff24;
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
             in_stack_ffffffffffffff08,(SourceLineInfo *)this,capturedExpression,
             in_stack_fffffffffffffefc);
  Catch::Decomposer::operator<=
            ((Decomposer *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
             (int *)0x22b9ad);
  Catch::ExprLhs<int_const&>::operator>
            (in_stack_ffffffffffffff28,(int *)((ulong)in_stack_ffffffffffffff24 << 0x20));
  Catch::AssertionHandler::handleExpr
            (this,(ITransientExpression *)
                  CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
  Catch::BinaryExpr<const_int_&,_const_int_&>::~BinaryExpr
            ((BinaryExpr<const_int_&,_const_int_&> *)0x22b9fa);
  Catch::AssertionHandler::complete(this);
  Catch::AssertionHandler::~AssertionHandler(this);
  iVar4 = 0;
  iVar3 = 1;
  for (iVar2 = 0; iVar2 < local_c; iVar2 = iVar2 + 1) {
    iVar1 = duckdb_shell_sqlite3_value_type(*(undefined8 *)(local_18 + (long)iVar2 * 8));
    if (iVar1 == 5) {
      iVar3 = 5;
    }
    else {
      iVar1 = duckdb_shell_sqlite3_value_int(*(undefined8 *)(local_18 + (long)iVar2 * 8));
      iVar4 = iVar1 + iVar4;
    }
  }
  if (iVar3 == 5) {
    duckdb_shell_sqlite3_result_null(local_8);
  }
  else {
    duckdb_shell_sqlite3_result_int(local_8,iVar4);
  }
  return;
}

Assistant:

static void sum_cols_int_check_nulls(sqlite3_context *context, int argc, sqlite3_value **argv) {
	REQUIRE(argc > 0);
	auto sum = 0;
	int res_type = SQLITE_INTEGER;
	for (int i = 0; i < argc; ++i) {
		int type = sqlite3_value_type(argv[i]);
		if (type == SQLITE_NULL) {
			res_type = SQLITE_NULL;
		} else {
			sum += sqlite3_value_int(argv[i]);
		}
	}
	if (res_type == SQLITE_NULL) {
		sqlite3_result_null(context);
	} else {
		sqlite3_result_int(context, sum);
	}
}